

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.h
# Opt level: O0

HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> * __thiscall
HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator>::Copy
          (HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *this)

{
  HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *pHVar1;
  DictionaryStats *pDVar2;
  uint local_1c;
  uint i;
  HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *newTable;
  HashTable<ObjWriteGuardBucket,_Memory::ArenaAllocator> *this_local;
  
  pHVar1 = New(this->alloc,this->tableSize);
  for (local_1c = 0; local_1c < this->tableSize; local_1c = local_1c + 1) {
    SListBase<Bucket<ObjWriteGuardBucket>,_Memory::ArenaAllocator,_RealCount>::
    CopyTo<&Bucket<ObjWriteGuardBucket>::Copy>
              (this->table + local_1c,this->alloc,pHVar1->table + local_1c);
  }
  if (this->stats != (DictionaryStats *)0x0) {
    pDVar2 = DictionaryStats::Clone(this->stats);
    pHVar1->stats = pDVar2;
  }
  return pHVar1;
}

Assistant:

HashTable<T> *Copy()
    {
        HashTable<T> *newTable = HashTable<T>::New(this->alloc, this->tableSize);

        for (uint i = 0; i < this->tableSize; i++)
        {
            this->table[i].template CopyTo<Bucket<T>::Copy>(this->alloc, newTable->table[i]);
        }
#if PROFILE_DICTIONARY
        if (stats)
            newTable->stats = stats->Clone();
#endif
        return newTable;
    }